

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

string * __thiscall
GEO::FileSystem::Node::load_file_as_string(string *__return_storage_ptr__,Node *this,string *path)

{
  FILE *__stream;
  size_t __n;
  size_t sVar1;
  ostream *poVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __stream = fopen((path->_M_dataplus)._M_p,"r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    if (__n != 0) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)__n);
      sVar1 = fread((__return_storage_ptr__->_M_dataplus)._M_p,1,__n,__stream);
      if (sVar1 != __n) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"FileSystem","");
        poVar2 = Logger::warn(&local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"Problem occured when reading ",0x1d);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::load_file_as_string(const std::string& path) {
	    std::string result;
	    FILE* f = fopen(path.c_str(),"r");
	    if(f != nullptr) {
		// Get file length
		fseek(f, 0L, SEEK_END);
		size_t length = size_t(ftell(f));
		fseek(f, 0L, SEEK_SET);
		if(length != 0) {
		    result.resize(length);
		    size_t read_length = fread(&result[0], 1, length, f);
		    if(read_length != length) {
			Logger::warn("FileSystem")
			    << "Problem occured when reading "
			    << path
			    << std::endl;
			    
		    }
		}
		fclose(f);
	    }
	    return result;
	}